

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

Sub * google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub
                (Sub *__return_storage_ptr__,Options *options,Printer *p)

{
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  string local_108;
  anon_class_16_2_37da2c3b_for_cb local_e8;
  Sub local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"getter",&local_129);
  local_e8.options = options;
  local_e8.p = p;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub(google::protobuf::compiler::cpp::Options_const&,google::protobuf::io::Printer*)::_lambda()_1_>
            (&local_d8,&local_128,&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,anon_var_dwarf_651463 + 5,&local_12a);
  io::Printer::Sub::WithSuffix(__return_storage_ptr__,&local_d8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  io::Printer::Sub::~Sub(&local_d8);
  std::__cxx11::string::~string((string *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

inline auto GetEmitRepeatedFieldGetterSub(const Options& options,
                                          io::Printer* p) {
  return io::Printer::Sub{
      "getter",
      [&options, p] {
        switch (options.bounds_check_mode) {
          case BoundsCheckMode::kNoEnforcement:
            p->Emit(R"cc(_internal_$name_internal$().Get(index))cc");
            break;
          case BoundsCheckMode::kReturnDefaultValue:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrDefault(_internal_$name_internal$(), index)
            )cc");
            break;
          case BoundsCheckMode::kAbort:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrAbort(_internal_$name_internal$(), index)
            )cc");
            break;
        }
      }}
      .WithSuffix("");
}